

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O1

bool __thiscall SQTable::Get(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQObjectType SVar4;
  ulong uVar5;
  _HashNode *p_Var6;
  SQObjectValue *pSVar7;
  bool bVar8;
  
  SVar4 = (key->super_SQObject)._type;
  if ((int)SVar4 < 0x5000002) {
    if (SVar4 == OT_NULL) {
      return false;
    }
    if (SVar4 == OT_BOOL) goto LAB_0012b92f;
  }
  else {
    if (SVar4 == OT_INTEGER) {
LAB_0012b92f:
      uVar5 = (key->super_SQObject)._unVal.nInteger;
      goto LAB_0012b94c;
    }
    if (SVar4 == OT_FLOAT) {
      uVar5 = (ulong)(key->super_SQObject)._unVal.fFloat;
      goto LAB_0012b94c;
    }
    if (SVar4 == OT_STRING) {
      uVar5 = ((key->super_SQObject)._unVal.pString)->_hash;
      goto LAB_0012b94c;
    }
  }
  uVar5 = (key->super_SQObject)._unVal.nInteger >> 3;
LAB_0012b94c:
  p_Var6 = this->_nodes + (this->_numofnodes - 1U & uVar5);
  do {
    if (((p_Var6->key).super_SQObject._unVal.pTable == (key->super_SQObject)._unVal.pTable) &&
       ((p_Var6->key).super_SQObject._type == SVar4)) goto LAB_0012b97c;
    p_Var6 = p_Var6->next;
  } while (p_Var6 != (_HashNode *)0x0);
  p_Var6 = (_HashNode *)0x0;
LAB_0012b97c:
  bVar8 = p_Var6 != (_HashNode *)0x0;
  if (bVar8) {
    SVar4 = (p_Var6->val).super_SQObject._type;
    pSVar7 = &(p_Var6->val).super_SQObject._unVal;
    if (SVar4 == OT_WEAKREF) {
      SVar4 = (pSVar7->pWeakRef->_obj)._type;
      pSVar7 = &(pSVar7->pWeakRef->_obj)._unVal;
    }
    SVar2 = (val->super_SQObject)._type;
    pSVar3 = (val->super_SQObject)._unVal.pTable;
    (val->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)*(SQWeakRef **)pSVar7;
    (val->super_SQObject)._type = SVar4;
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &(((val->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    bVar8 = true;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return bVar8;
}

Assistant:

bool SQTable::Get(const SQObjectPtr &key,SQObjectPtr &val)
{
    if(type(key) == OT_NULL)
        return false;
    _HashNode *n = _Get(key, HashObj(key) & (_numofnodes - 1));
    if (n) {
        val = _realval(n->val);
        return true;
    }
    return false;
}